

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

float quaternion_difference_EXP(quaternion *q1,quaternion *q2)

{
  float fVar1;
  undefined1 local_28 [8];
  quaternion diff;
  quaternion *q2_local;
  quaternion *q1_local;
  
  local_28._0_4_ = (q2->field_0).q[0] - (q1->field_0).q[0];
  local_28._4_4_ = (q2->field_0).q[1] - (q1->field_0).q[1];
  diff.field_0.q[0] = (q2->field_0).q[2] - (q1->field_0).q[2];
  diff.field_0.q[1] = (q2->field_0).q[3] - (q1->field_0).q[3];
  diff.field_0._8_8_ = q2;
  fVar1 = quaternion_norm((quaternion *)local_28);
  return fVar1;
}

Assistant:

HYPAPI HYP_FLOAT quaternion_difference_EXP(const struct quaternion *q1, const struct quaternion *q2)
{
	struct quaternion diff;

	diff.x = q2->x - q1->x;
	diff.y = q2->y - q1->y;
	diff.z = q2->z - q1->z;
	diff.w = q2->w - q1->w;
	return quaternion_norm(&diff);
}